

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaH_getn(Table *t)

{
  TValue *pTVar1;
  uint uVar2;
  uint key;
  uint uVar3;
  uint uVar4;
  
  uVar3 = t->sizearray;
  if ((uVar3 == 0) || (t->array[uVar3 - 1].tt != 0)) {
    if (t->node != &dummynode_) {
      uVar4 = uVar3 + 1;
      do {
        uVar2 = uVar4;
        pTVar1 = luaH_getnum(t,uVar2);
        if (pTVar1->tt == 0) {
          while (uVar4 = uVar3, 1 < uVar2 - uVar4) {
            key = uVar4 + uVar2 >> 1;
            pTVar1 = luaH_getnum(t,key);
            uVar3 = key;
            if (pTVar1->tt == 0) {
              uVar3 = uVar4;
              uVar2 = key;
            }
          }
          return uVar4;
        }
        uVar4 = uVar2 * 2;
        uVar3 = uVar2;
      } while (uVar2 * 2 < 0x7ffffffe);
      uVar3 = 0xffffffff;
      do {
        pTVar1 = luaH_getnum(t,uVar3 + 2);
        uVar3 = uVar3 + 1;
      } while (pTVar1->tt != 0);
    }
  }
  else {
    uVar4 = uVar3;
    uVar2 = 0;
    while (uVar3 = uVar2, 1 < uVar4 - uVar3) {
      uVar2 = uVar3 + uVar4 >> 1;
      if (t->array[uVar2 - 1].tt == 0) {
        uVar4 = uVar2;
        uVar2 = uVar3;
      }
    }
  }
  return uVar3;
}

Assistant:

static int luaH_getn(Table*t){
unsigned int j=t->sizearray;
if(j>0&&ttisnil(&t->array[j-1])){
unsigned int i=0;
while(j-i>1){
unsigned int m=(i+j)/2;
if(ttisnil(&t->array[m-1]))j=m;
else i=m;
}
return i;
}
else if(t->node==(&dummynode_))
return j;
else return unbound_search(t,j);
}